

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request.c
# Opt level: O0

ngx_int_t ngx_http_alloc_large_header_buffer(ngx_http_request_t *r,ngx_uint_t request_line)

{
  void *pvVar1;
  ngx_http_connection_t *pnVar2;
  ngx_buf_t *__dest;
  u_char *local_58;
  ngx_http_core_srv_conf_t *cscf;
  ngx_http_connection_t *hc;
  ngx_chain_t *cl;
  ngx_buf_t *b;
  u_char *new;
  u_char *old;
  ngx_uint_t request_line_local;
  ngx_http_request_t *r_local;
  
  if ((r->connection->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,r->connection->log,0,"http alloc large header buffer");
  }
  if ((request_line == 0) || (r->state != 0)) {
    if (request_line == 0) {
      local_58 = r->header_name_start;
    }
    else {
      local_58 = r->request_start;
    }
    pvVar1 = r->srv_conf[ngx_http_core_module.ctx_index];
    if ((r->state == 0) ||
       ((ulong)((long)r->header_in->pos - (long)local_58) < *(ulong *)((long)pvVar1 + 0x60))) {
      pnVar2 = r->http_connection;
      if (pnVar2->free == (ngx_chain_t *)0x0) {
        if (*(long *)((long)pvVar1 + 0x58) <= pnVar2->nbusy) {
          return -5;
        }
        cl = (ngx_chain_t *)
             ngx_create_temp_buf(r->connection->pool,*(size_t *)((long)pvVar1 + 0x60));
        if ((ngx_buf_t *)cl == (ngx_buf_t *)0x0) {
          return -1;
        }
        hc = (ngx_http_connection_t *)ngx_alloc_chain_link(r->connection->pool);
        if (hc == (ngx_http_connection_t *)0x0) {
          return -1;
        }
        hc->addr_conf = (ngx_http_addr_conf_t *)cl;
        if ((r->connection->log->log_level & 0x100) != 0) {
          ngx_log_error_core(8,r->connection->log,0,"http large header alloc: %p %uz",
                             ((ngx_buf_t *)cl)->pos,
                             (long)((ngx_buf_t *)cl)->end - (long)((ngx_buf_t *)cl)->last);
        }
      }
      else {
        hc = (ngx_http_connection_t *)pnVar2->free;
        pnVar2->free = (ngx_chain_t *)hc->conf_ctx;
        cl = (ngx_chain_t *)hc->addr_conf;
        if ((r->connection->log->log_level & 0x100) != 0) {
          ngx_log_error_core(8,r->connection->log,0,"http large header free: %p %uz",
                             ((ngx_buf_t *)cl)->pos,
                             (long)((ngx_buf_t *)cl)->end - (long)((ngx_buf_t *)cl)->last);
        }
      }
      hc->conf_ctx = (ngx_http_conf_ctx_t *)pnVar2->busy;
      pnVar2->busy = (ngx_chain_t *)hc;
      pnVar2->nbusy = pnVar2->nbusy + 1;
      if (r->state == 0) {
        r->header_in = (ngx_buf_t *)cl;
        r_local = (ngx_http_request_t *)0x0;
      }
      else {
        if ((r->connection->log->log_level & 0x100) != 0) {
          ngx_log_error_core(8,r->connection->log,0,"http large header copy: %uz",
                             (long)r->header_in->pos - (long)local_58);
        }
        __dest = cl[2].buf;
        memcpy(__dest,local_58,(long)r->header_in->pos - (long)local_58);
        cl->buf = (ngx_buf_t *)((long)__dest + ((long)r->header_in->pos - (long)local_58));
        cl->next = (ngx_chain_t *)((long)__dest + ((long)r->header_in->pos - (long)local_58));
        if (request_line == 0) {
          r->header_name_start = (u_char *)__dest;
          r->header_name_end =
               (u_char *)((long)__dest + ((long)r->header_name_end - (long)local_58));
          r->header_start = (u_char *)((long)__dest + ((long)r->header_start - (long)local_58));
          r->header_end = (u_char *)((long)__dest + ((long)r->header_end - (long)local_58));
        }
        else {
          r->request_start = (u_char *)__dest;
          if (r->request_end != (u_char *)0x0) {
            r->request_end = (u_char *)((long)__dest + ((long)r->request_end - (long)local_58));
          }
          r->method_end = (u_char *)((long)__dest + ((long)r->method_end - (long)local_58));
          r->uri_start = (u_char *)((long)__dest + ((long)r->uri_start - (long)local_58));
          r->uri_end = (u_char *)((long)__dest + ((long)r->uri_end - (long)local_58));
          if (r->schema_start != (u_char *)0x0) {
            r->schema_start = (u_char *)((long)__dest + ((long)r->schema_start - (long)local_58));
            r->schema_end = (u_char *)((long)__dest + ((long)r->schema_end - (long)local_58));
          }
          if ((r->host_start != (u_char *)0x0) &&
             (r->host_start = (u_char *)((long)__dest + ((long)r->host_start - (long)local_58)),
             r->host_end != (u_char *)0x0)) {
            r->host_end = (u_char *)((long)__dest + ((long)r->host_end - (long)local_58));
          }
          if (r->port_start != (u_char *)0x0) {
            r->port_start = (u_char *)((long)__dest + ((long)r->port_start - (long)local_58));
            r->port_end = (u_char *)((long)__dest + ((long)r->port_end - (long)local_58));
          }
          if (r->uri_ext != (u_char *)0x0) {
            r->uri_ext = (u_char *)((long)__dest + ((long)r->uri_ext - (long)local_58));
          }
          if (r->args_start != (u_char *)0x0) {
            r->args_start = (u_char *)((long)__dest + ((long)r->args_start - (long)local_58));
          }
          if ((r->http_protocol).data != (u_char *)0x0) {
            (r->http_protocol).data =
                 (u_char *)((long)__dest + ((long)(r->http_protocol).data - (long)local_58));
          }
        }
        r->header_in = (ngx_buf_t *)cl;
        r_local = (ngx_http_request_t *)0x0;
      }
    }
    else {
      r_local = (ngx_http_request_t *)0xfffffffffffffffb;
    }
  }
  else {
    r->header_in->pos = r->header_in->start;
    r->header_in->last = r->header_in->start;
    r_local = (ngx_http_request_t *)0x0;
  }
  return (ngx_int_t)r_local;
}

Assistant:

static ngx_int_t
ngx_http_alloc_large_header_buffer(ngx_http_request_t *r,
    ngx_uint_t request_line)
{
    u_char                    *old, *new;
    ngx_buf_t                 *b;
    ngx_chain_t               *cl;
    ngx_http_connection_t     *hc;
    ngx_http_core_srv_conf_t  *cscf;

    ngx_log_debug0(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "http alloc large header buffer");

    if (request_line && r->state == 0) {

        /* the client fills up the buffer with "\r\n" */

        r->header_in->pos = r->header_in->start;
        r->header_in->last = r->header_in->start;

        return NGX_OK;
    }

    old = request_line ? r->request_start : r->header_name_start;

    cscf = ngx_http_get_module_srv_conf(r, ngx_http_core_module);

    if (r->state != 0
        && (size_t) (r->header_in->pos - old)
                                     >= cscf->large_client_header_buffers.size)
    {
        return NGX_DECLINED;
    }

    hc = r->http_connection;

    if (hc->free) {
        cl = hc->free;
        hc->free = cl->next;

        b = cl->buf;

        ngx_log_debug2(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                       "http large header free: %p %uz",
                       b->pos, b->end - b->last);

    } else if (hc->nbusy < cscf->large_client_header_buffers.num) {

        b = ngx_create_temp_buf(r->connection->pool,
                                cscf->large_client_header_buffers.size);
        if (b == NULL) {
            return NGX_ERROR;
        }

        cl = ngx_alloc_chain_link(r->connection->pool);
        if (cl == NULL) {
            return NGX_ERROR;
        }

        cl->buf = b;

        ngx_log_debug2(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                       "http large header alloc: %p %uz",
                       b->pos, b->end - b->last);

    } else {
        return NGX_DECLINED;
    }

    cl->next = hc->busy;
    hc->busy = cl;
    hc->nbusy++;

    if (r->state == 0) {
        /*
         * r->state == 0 means that a header line was parsed successfully
         * and we do not need to copy incomplete header line and
         * to relocate the parser header pointers
         */

        r->header_in = b;

        return NGX_OK;
    }

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "http large header copy: %uz", r->header_in->pos - old);

    new = b->start;

    ngx_memcpy(new, old, r->header_in->pos - old);

    b->pos = new + (r->header_in->pos - old);
    b->last = new + (r->header_in->pos - old);

    if (request_line) {
        r->request_start = new;

        if (r->request_end) {
            r->request_end = new + (r->request_end - old);
        }

        r->method_end = new + (r->method_end - old);

        r->uri_start = new + (r->uri_start - old);
        r->uri_end = new + (r->uri_end - old);

        if (r->schema_start) {
            r->schema_start = new + (r->schema_start - old);
            r->schema_end = new + (r->schema_end - old);
        }

        if (r->host_start) {
            r->host_start = new + (r->host_start - old);
            if (r->host_end) {
                r->host_end = new + (r->host_end - old);
            }
        }

        if (r->port_start) {
            r->port_start = new + (r->port_start - old);
            r->port_end = new + (r->port_end - old);
        }

        if (r->uri_ext) {
            r->uri_ext = new + (r->uri_ext - old);
        }

        if (r->args_start) {
            r->args_start = new + (r->args_start - old);
        }

        if (r->http_protocol.data) {
            r->http_protocol.data = new + (r->http_protocol.data - old);
        }

    } else {
        r->header_name_start = new;
        r->header_name_end = new + (r->header_name_end - old);
        r->header_start = new + (r->header_start - old);
        r->header_end = new + (r->header_end - old);
    }

    r->header_in = b;

    return NGX_OK;
}